

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_std_getenv(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  char *__name;
  char *str;
  ulong uVar1;
  ulong uVar2;
  JSValue JVar3;
  undefined8 uStack_20;
  
  __name = JS_ToCString(ctx,*argv);
  if (__name == (char *)0x0) {
    uStack_20 = 6;
  }
  else {
    str = getenv(__name);
    JS_FreeCString(ctx,__name);
    if (str != (char *)0x0) {
      JVar3 = JS_NewString(ctx,str);
      uStack_20 = JVar3.tag;
      uVar2 = (ulong)JVar3.u.ptr & 0xffffffff00000000;
      uVar1 = (ulong)JVar3.u._0_4_;
      goto LAB_0010e753;
    }
    uStack_20 = 3;
  }
  uVar1 = 0;
  uVar2 = 0;
LAB_0010e753:
  JVar3.u.ptr = (void *)(uVar1 | uVar2);
  JVar3.tag = uStack_20;
  return JVar3;
}

Assistant:

static JSValue js_std_getenv(JSContext *ctx, JSValueConst this_val,
                           int argc, JSValueConst *argv)
{
    const char *name, *str;
    name = JS_ToCString(ctx, argv[0]);
    if (!name)
        return JS_EXCEPTION;
    str = getenv(name);
    JS_FreeCString(ctx, name);
    if (!str)
        return JS_UNDEFINED;
    else
        return JS_NewString(ctx, str);
}